

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::shiftFvec(SPxSolverBase<double> *this)

{
  double dVar1;
  double to;
  double dVar2;
  uint i;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Real RVar7;
  
  dVar3 = entertol(this);
  dVar4 = entertol(this);
  dVar5 = entertol(this);
  dVar6 = epsilon(this);
  i = (this->thecovectors->set).thenum;
  while (0 < (int)i) {
    i = i - 1;
    dVar1 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[i];
    to = (this->theFvec->super_VectorBase<double>).val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[i];
    dVar2 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[i];
    if (to <= (dVar5 - dVar6) + dVar1) {
      if (to < dVar2 - (dVar5 - dVar6)) {
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          RVar7 = Random::next(&this->random,dVar3 * 10.0,dVar4 * 100.0);
          shiftLBbound(this,i,to - RVar7);
        }
        else {
          shiftLBbound(this,i,to);
          (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[i] =
               (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[i];
        }
      }
    }
    else if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      RVar7 = Random::next(&this->random,dVar3 * 10.0,dVar4 * 100.0);
      shiftUBbound(this,i,RVar7 + to);
    }
    else {
      shiftUBbound(this,i,to);
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] =
           (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[i];
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}